

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
rc::gen::container<std::__cxx11::string,char>
          (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,gen *this,Gen<char> *gens)

{
  anon_class_48_2_4a94e98e local_40;
  
  Gen<char>::Gen(&local_40.gens,(Gen<char> *)this);
  Gen<std::__cxx11::string>::
  Gen<rc::gen::container<std::__cxx11::string,char>(rc::Gen<char>)::_lambda(rc::Random_const&,int)_1_,void>
            ((Gen<std::__cxx11::string> *)__return_storage_ptr__,&local_40);
  Gen<char>::~Gen(&local_40.gens);
  return __return_storage_ptr__;
}

Assistant:

Gen<Container> container(Gen<Ts>... gens) {
  using Strategy = detail::GenericContainerStrategy<Container>;
  detail::ContainerHelper<Container, Strategy> helper{Strategy()};

  return [=](const Random &random, int size) {
    return helper.generate(random, size, gens...);
  };
}